

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O1

void pnga_patch_enum(Integer g_a,Integer lo,Integer hi,void *start,void *stride)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Integer proc;
  long lVar9;
  ulong uVar10;
  int iVar11;
  double dVar12;
  long lVar13;
  double dVar14;
  long lVar15;
  int iVar16;
  undefined4 uVar17;
  undefined4 uVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  void *ptr;
  Integer hip;
  Integer lop;
  Integer type;
  Integer ndim;
  Integer ld;
  Integer dims [1];
  double *local_68;
  long local_60;
  long local_58;
  long local_50;
  Integer local_48;
  Integer local_40;
  Integer local_38;
  
  pnga_sync();
  proc = pnga_nodeid();
  pnga_check_handle(g_a,"ga_patch_enum");
  local_48 = pnga_ndim(g_a);
  if (1 < local_48) {
    pnga_error("ga_patch_enum:applicable to 1-dim arrays",local_48);
  }
  pnga_inquire(g_a,&local_50,&local_48,&local_38);
  pnga_distribution(g_a,proc,&local_58,&local_60);
  if ((local_60 < lo || local_58 < 1) || hi < local_58) goto LAB_001353f4;
  if (local_58 < lo) {
    local_58 = lo;
  }
  lVar13 = local_58;
  if (hi < local_60) {
    local_60 = hi;
  }
  lVar15 = local_60;
  pnga_access_ptr(g_a,&local_58,&local_60,&local_68,&local_40);
  auVar8 = _DAT_001b0d30;
  if (local_50 - 0x3e9U < 0x10) {
    lVar15 = lVar15 - lVar13;
    lVar9 = lVar13 - lo;
    uVar17 = (undefined4)lVar15;
    uVar21 = (undefined4)((ulong)lVar15 >> 0x20);
    switch(local_50) {
    case 0x3e9:
      if (-1 < lVar15) {
        iVar5 = *stride;
        auVar18._8_4_ = uVar17;
        auVar18._0_8_ = lVar15;
        auVar18._12_4_ = uVar21;
        iVar16 = (int)lVar13 - (int)lo;
        iVar11 = (iVar16 + 1) * iVar5 + *start;
        iVar16 = iVar16 * iVar5 + *start;
        uVar10 = 0;
        auVar18 = auVar18 ^ _DAT_001b0d30;
        auVar22 = _DAT_001b0020;
        do {
          auVar28 = auVar22 ^ auVar8;
          if ((bool)(~(auVar28._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar28._0_4_ ||
                      auVar18._4_4_ < auVar28._4_4_) & 1)) {
            *(int *)((long)local_68 + uVar10 * 4) = iVar16;
          }
          if ((auVar28._12_4_ != auVar18._12_4_ || auVar28._8_4_ <= auVar18._8_4_) &&
              auVar28._12_4_ <= auVar18._12_4_) {
            *(int *)((long)local_68 + uVar10 * 4 + 4) = iVar11;
          }
          uVar10 = uVar10 + 2;
          lVar13 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 2;
          auVar22._8_8_ = lVar13 + 2;
          iVar11 = iVar11 + iVar5 * 2;
          iVar16 = iVar16 + iVar5 * 2;
        } while ((lVar15 + 2U & 0xfffffffffffffffe) != uVar10);
      }
      break;
    case 0x3ea:
      if (-1 < lVar15) {
        lVar13 = *stride;
        auVar19._8_4_ = uVar17;
        auVar19._0_8_ = lVar15;
        auVar19._12_4_ = uVar21;
        dVar14 = (double)((lVar9 + 1) * lVar13 + *start);
        dVar12 = (double)(lVar13 * lVar9 + *start);
        uVar10 = 0;
        auVar19 = auVar19 ^ _DAT_001b0d30;
        auVar23 = _DAT_001b0020;
        do {
          auVar28 = auVar23 ^ auVar8;
          if ((bool)(~(auVar28._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar28._0_4_ ||
                      auVar19._4_4_ < auVar28._4_4_) & 1)) {
            local_68[uVar10] = dVar12;
          }
          if ((auVar28._12_4_ != auVar19._12_4_ || auVar28._8_4_ <= auVar19._8_4_) &&
              auVar28._12_4_ <= auVar19._12_4_) {
            local_68[uVar10 + 1] = dVar14;
          }
          uVar10 = uVar10 + 2;
          lVar9 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 2;
          auVar23._8_8_ = lVar9 + 2;
          dVar14 = (double)((long)dVar14 + lVar13 * 2);
          dVar12 = (double)((long)dVar12 + lVar13 * 2);
        } while ((lVar15 + 2U & 0xfffffffffffffffe) != uVar10);
      }
      break;
    case 0x3eb:
      if (-1 < lVar15) {
        fVar1 = *start;
        fVar2 = *stride;
        auVar24._8_4_ = uVar17;
        auVar24._0_8_ = lVar15;
        auVar24._12_4_ = uVar21;
        uVar10 = 0;
        auVar24 = auVar24 ^ _DAT_001b0d30;
        auVar26 = _DAT_001b0020;
        do {
          auVar28 = auVar26 ^ auVar8;
          if ((bool)(~(auVar28._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar28._0_4_ ||
                      auVar24._4_4_ < auVar28._4_4_) & 1)) {
            *(float *)((long)local_68 + uVar10 * 4) = (float)lVar9 * fVar2 + fVar1;
          }
          if ((auVar28._12_4_ != auVar24._12_4_ || auVar28._8_4_ <= auVar24._8_4_) &&
              auVar28._12_4_ <= auVar24._12_4_) {
            *(float *)((long)local_68 + uVar10 * 4 + 4) = (float)(lVar9 + 1) * fVar2 + fVar1;
          }
          uVar10 = uVar10 + 2;
          lVar13 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 2;
          auVar26._8_8_ = lVar13 + 2;
          lVar9 = lVar9 + 2;
        } while ((lVar15 + 2U & 0xfffffffffffffffe) != uVar10);
      }
      break;
    case 0x3ec:
      if (-1 < lVar15) {
        dVar12 = *start;
        dVar14 = *stride;
        auVar25._8_4_ = uVar17;
        auVar25._0_8_ = lVar15;
        auVar25._12_4_ = uVar21;
        uVar10 = 0;
        auVar25 = auVar25 ^ _DAT_001b0d30;
        auVar27 = _DAT_001b0020;
        do {
          auVar28 = auVar27 ^ auVar8;
          if ((bool)(~(auVar28._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar28._0_4_ ||
                      auVar25._4_4_ < auVar28._4_4_) & 1)) {
            local_68[uVar10] = (double)lVar9 * dVar14 + dVar12;
          }
          if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
              auVar28._12_4_ <= auVar25._12_4_) {
            local_68[uVar10 + 1] = (double)(lVar9 + 1) * dVar14 + dVar12;
          }
          uVar10 = uVar10 + 2;
          lVar13 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 2;
          auVar27._8_8_ = lVar13 + 2;
          lVar9 = lVar9 + 2;
        } while ((lVar15 + 2U & 0xfffffffffffffffe) != uVar10);
      }
      break;
    default:
      goto switchD_00134f15_caseD_3ed;
    case 0x3ee:
      if (-1 < lVar15) {
        uVar3 = *start;
        uVar4 = *stride;
        lVar13 = 0;
        do {
          local_68[lVar13] =
               (double)CONCAT44((float)(lVar9 + lVar13) * (float)((ulong)uVar4 >> 0x20) +
                                (float)((ulong)uVar3 >> 0x20),
                                (float)(lVar9 + lVar13) * (float)uVar4 + (float)uVar3);
          lVar13 = lVar13 + 1;
        } while (lVar15 + 1 != lVar13);
      }
      break;
    case 0x3ef:
      if (-1 < lVar15) {
        dVar12 = *start;
        dVar14 = *(double *)((long)start + 8);
        dVar6 = *stride;
        dVar7 = *(double *)((long)stride + 8);
        lVar15 = lVar15 + 1;
        do {
          *local_68 = (double)lVar9 * dVar6 + dVar12;
          local_68[1] = (double)lVar9 * dVar7 + dVar14;
          local_68 = local_68 + 2;
          lVar9 = lVar9 + 1;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      break;
    case 0x3f8:
      if (-1 < lVar15) {
        lVar13 = *stride;
        auVar20._8_4_ = uVar17;
        auVar20._0_8_ = lVar15;
        auVar20._12_4_ = uVar21;
        dVar14 = (double)((lVar9 + 1) * lVar13 + *start);
        dVar12 = (double)(lVar13 * lVar9 + *start);
        uVar10 = 0;
        auVar20 = auVar20 ^ _DAT_001b0d30;
        auVar28 = _DAT_001b0020;
        do {
          auVar27 = auVar28 ^ auVar8;
          if ((bool)(~(auVar27._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar27._0_4_ ||
                      auVar20._4_4_ < auVar27._4_4_) & 1)) {
            local_68[uVar10] = dVar12;
          }
          if ((auVar27._12_4_ != auVar20._12_4_ || auVar27._8_4_ <= auVar20._8_4_) &&
              auVar27._12_4_ <= auVar20._12_4_) {
            local_68[uVar10 + 1] = dVar14;
          }
          uVar10 = uVar10 + 2;
          lVar9 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 2;
          auVar28._8_8_ = lVar9 + 2;
          dVar14 = (double)((long)dVar14 + lVar13 * 2);
          dVar12 = (double)((long)dVar12 + lVar13 * 2);
        } while ((lVar15 + 2U & 0xfffffffffffffffe) != uVar10);
      }
    }
  }
  else {
switchD_00134f15_caseD_3ed:
    pnga_error("ga_patch_enum:wrong data type ",local_50);
  }
  pnga_release_update(g_a,&local_58,&local_60);
LAB_001353f4:
  pnga_sync();
  return;
}

Assistant:

void pnga_patch_enum(Integer g_a, Integer lo, Integer hi, void* start, void* stride)
{
Integer dims[1],lop,hip;
Integer ndim, type, me, off;

   pnga_sync();
   me = pnga_nodeid();

   pnga_check_handle(g_a, "ga_patch_enum");

   ndim = pnga_ndim(g_a);
   if (ndim > 1) pnga_error("ga_patch_enum:applicable to 1-dim arrays",ndim);

   pnga_inquire(g_a, &type, &ndim, dims);
   pnga_distribution(g_a, me, &lop, &hip);

   if ( lop > 0 ){ /* we get 0 if no elements stored on this process */

      /* take product of patch owned and specified by the user */ 
      if(hi <lop || hip <lo); /* we got no elements to update */
      else{
        void *ptr;
        Integer ld;
        register Integer i;
        register Integer nelem;

        if(lop < lo)lop = lo;
        if(hip > hi)hip = hi;
        nelem = hip-lop+1;
        off = lop - lo;
        pnga_access_ptr(g_a, &lop, &hip, &ptr, &ld);
        
        switch (type) {
#define TYPE_CASE(MT,T,AT)                                                  \
            case MT:                                                        \
                {                                                           \
                    T *aptr = (T*)ptr;                                      \
                    T astart = *((T*)start);                                \
                    T astride = *((T*)stride);                              \
                    for (i=0; i<nelem; i++) {                               \
                        T offset;                                           \
                        assign_mul_constant_##AT(offset,off+i,astride);     \
                        assign_add_##AT(aptr[i],astart,offset);             \
                    }                                                       \
                    break;                                                  \
                }
#include "types.xh"
#undef TYPE_CASE
            default: pnga_error("ga_patch_enum:wrong data type ",type);
        }

        pnga_release_update(g_a, &lop, &hip);
      }
   }
   
   pnga_sync();
}